

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

uint AnalyzeAlignment(ExpressionContext *ctx,SynAlign *syntax)

{
  bool bVar1;
  ExprBase *pEVar2;
  ExprIntegerLiteral *pEVar3;
  ExprIntegerLiteral *alignValue;
  ExprBase *align;
  SynAlign *syntax_local;
  ExpressionContext *ctx_local;
  
  if (syntax->value == (SynBase *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    pEVar2 = AnalyzeExpression(ctx,syntax->value);
    bVar1 = isType<TypeError>(pEVar2->type);
    if (bVar1) {
      ctx_local._4_4_ = 0;
    }
    else {
      pEVar2 = CreateCast(ctx,&syntax->super_SynBase,pEVar2,ctx->typeLong,false);
      pEVar2 = anon_unknown.dwarf_6f1cc::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar2);
      pEVar3 = getType<ExprIntegerLiteral>(pEVar2);
      if (pEVar3 == (ExprIntegerLiteral *)0x0) {
        anon_unknown.dwarf_6f1cc::Report
                  (ctx,&syntax->super_SynBase,"ERROR: alignment must be a constant expression");
        ctx_local._4_4_ = 0;
      }
      else if (pEVar3->value < 0x11) {
        if ((pEVar3->value & pEVar3->value - 1U) == 0) {
          ctx_local._4_4_ = (uint)pEVar3->value;
        }
        else {
          anon_unknown.dwarf_6f1cc::Report
                    (ctx,&syntax->super_SynBase,"ERROR: alignment must be power of two");
          ctx_local._4_4_ = 0;
        }
      }
      else {
        anon_unknown.dwarf_6f1cc::Report
                  (ctx,&syntax->super_SynBase,"ERROR: alignment must be less than 16 bytes");
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

unsigned AnalyzeAlignment(ExpressionContext &ctx, SynAlign *syntax)
{
	// noalign
	if(!syntax->value)
		return 1;

	ExprBase *align = AnalyzeExpression(ctx, syntax->value);

	// Some info about aignment expression tree is lost
	if(isType<TypeError>(align->type))
		return 0;

	if(ExprIntegerLiteral *alignValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, align, ctx.typeLong, false))))
	{
		if(alignValue->value > 16)
		{
			Report(ctx, syntax, "ERROR: alignment must be less than 16 bytes");

			return 0;
		}

		if(alignValue->value & (alignValue->value - 1))
		{
			Report(ctx, syntax, "ERROR: alignment must be power of two");

			return 0;
		}

		return unsigned(alignValue->value);
	}

	Report(ctx, syntax, "ERROR: alignment must be a constant expression");

	return 0;
}